

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O0

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  JDIMENSION JVar2;
  int iVar3;
  jpeg_c_coef_controller *pjVar4;
  jpeg_component_info *pjVar5;
  boolean bVar6;
  JBLOCKROW paJVar7;
  int local_dc;
  jpeg_component_info *compptr;
  JBLOCKROW buffer_ptr;
  JBLOCKROW MCU_buffer [10];
  JBLOCKARRAY buffer [4];
  JDIMENSION start_col;
  int blockcnt;
  int yoffset;
  int yindex;
  int xindex;
  int ci;
  int blkn;
  JDIMENSION last_iMCU_row;
  JDIMENSION last_MCU_col;
  JDIMENSION MCU_col_num;
  my_coef_ptr_conflict coef;
  JSAMPIMAGE input_buf_local;
  j_compress_ptr cinfo_local;
  
  pjVar4 = cinfo->coef;
  JVar1 = cinfo->MCUs_per_row;
  JVar2 = cinfo->total_iMCU_rows;
  for (yindex = 0; yindex < cinfo->comps_in_scan; yindex = yindex + 1) {
    pjVar5 = cinfo->cur_comp_info[yindex];
    paJVar7 = (JBLOCKROW)
              (*cinfo->mem->access_virt_barray)
                        ((j_common_ptr)cinfo,
                         *(jvirt_barray_ptr *)
                          (pjVar4[2].start_pass + (long)pjVar5->component_index * 8),
                         *(int *)&pjVar4[1].start_pass * pjVar5->v_samp_factor,pjVar5->v_samp_factor
                         ,0);
    MCU_buffer[(long)yindex + 9] = paJVar7;
  }
  start_col = *(JDIMENSION *)&pjVar4[1].compress_data;
  do {
    if (*(int *)((long)&pjVar4[1].compress_data + 4) <= (int)start_col) {
      *(int *)&pjVar4[1].start_pass = *(int *)&pjVar4[1].start_pass + 1;
      start_iMCU_row(cinfo);
      return 1;
    }
    for (last_iMCU_row = *(JDIMENSION *)((long)&pjVar4[1].start_pass + 4);
        last_iMCU_row < cinfo->MCUs_per_row; last_iMCU_row = last_iMCU_row + 1) {
      xindex = 0;
      for (yindex = 0; yindex < cinfo->comps_in_scan; yindex = yindex + 1) {
        pjVar5 = cinfo->cur_comp_info[yindex];
        iVar3 = pjVar5->MCU_width;
        if (last_iMCU_row < JVar1 - 1) {
          local_dc = pjVar5->MCU_width;
        }
        else {
          local_dc = pjVar5->last_col_width;
        }
        for (blockcnt = 0; blockcnt < pjVar5->MCU_height; blockcnt = blockcnt + 1) {
          if ((*(uint *)&pjVar4[1].start_pass < JVar2 - 1) ||
             ((int)(blockcnt + start_col) < pjVar5->last_row_height)) {
            compptr = (jpeg_component_info *)
                      (*(long *)(*MCU_buffer[(long)yindex + 9] +
                                (long)(int)(blockcnt + start_col) * 4) +
                      (ulong)(last_iMCU_row * iVar3) * 0x80);
            for (yoffset = 0; yoffset < local_dc; yoffset = yoffset + 1) {
              MCU_buffer[(long)xindex + -1] = (JBLOCKROW)compptr;
              compptr = (jpeg_component_info *)&compptr[1].height_in_blocks;
              xindex = xindex + 1;
            }
          }
          else {
            yoffset = 0;
          }
          for (; yoffset < pjVar5->MCU_width; yoffset = yoffset + 1) {
            MCU_buffer[(long)xindex + -1] = (JBLOCKROW)(&pjVar4[2].compress_data)[xindex];
            (*MCU_buffer[(long)xindex + -1])[0] = (*MCU_buffer[(long)(xindex + -1) + -1])[0];
            xindex = xindex + 1;
          }
        }
      }
      bVar6 = (*cinfo->entropy->encode_mcu)(cinfo,&buffer_ptr);
      if (bVar6 == 0) {
        *(JDIMENSION *)&pjVar4[1].compress_data = start_col;
        *(JDIMENSION *)((long)&pjVar4[1].start_pass + 4) = last_iMCU_row;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar4[1].start_pass + 4) = 0;
    start_col = start_col + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_output (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, blockcnt;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW MCU_buffer[C_MAX_BLOCKS_IN_MCU];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yindex+yoffset < compptr->last_row_height) {
	    /* Fill in pointers to real blocks in this row */
	    buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	    for (xindex = 0; xindex < blockcnt; xindex++)
	      MCU_buffer[blkn++] = buffer_ptr++;
	  } else {
	    /* At bottom of image, need a whole row of dummy blocks */
	    xindex = 0;
	  }
	  /* Fill in any dummy blocks needed in this row.
	   * Dummy blocks are filled in the same way as in jccoefct.c:
	   * all zeroes in the AC entries, DC entries equal to previous
	   * block's DC value.  The init routine has already zeroed the
	   * AC entries, so we need only set the DC entries correctly.
	   */
	  for (; xindex < compptr->MCU_width; xindex++) {
	    MCU_buffer[blkn] = coef->dummy_buffer[blkn];
	    MCU_buffer[blkn][0][0] = MCU_buffer[blkn-1][0][0];
	    blkn++;
	  }
	}
      }
      /* Try to write the MCU. */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}